

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLsslset Curl_init_sslset_nolock(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int i;
  curl_ssl_backend ***avail_local;
  char *name_local;
  curl_sslbackend id_local;
  
  if (avail != (curl_ssl_backend ***)0x0) {
    *avail = (curl_ssl_backend **)available_backends;
  }
  if (Curl_ssl == &Curl_ssl_multi) {
    for (local_24 = 0; available_backends[local_24] != (Curl_ssl *)0x0; local_24 = local_24 + 1) {
      if (((available_backends[local_24]->info).id == id) ||
         ((name != (char *)0x0 &&
          (iVar1 = curl_strequal((available_backends[local_24]->info).name,name), iVar1 != 0)))) {
        multissl_setup(available_backends[local_24]);
        return CURLSSLSET_OK;
      }
    }
    name_local._4_4_ = CURLSSLSET_UNKNOWN_BACKEND;
  }
  else {
    bVar2 = true;
    if ((id != (Curl_ssl->info).id) && (bVar2 = false, name != (char *)0x0)) {
      iVar1 = curl_strequal(name,(Curl_ssl->info).name);
      bVar2 = iVar1 != 0;
    }
    name_local._4_4_ = (CURLsslset)!bVar2;
  }
  return name_local._4_4_;
}

Assistant:

CURLsslset Curl_init_sslset_nolock(curl_sslbackend id, const char *name,
                                   const curl_ssl_backend ***avail)
{
  int i;

  if(avail)
    *avail = (const curl_ssl_backend **)&available_backends;

  if(Curl_ssl != &Curl_ssl_multi)
    return id == Curl_ssl->info.id ||
           (name && strcasecompare(name, Curl_ssl->info.name)) ?
           CURLSSLSET_OK :
#if defined(CURL_WITH_MULTI_SSL)
           CURLSSLSET_TOO_LATE;
#else
           CURLSSLSET_UNKNOWN_BACKEND;
#endif

  for(i = 0; available_backends[i]; i++) {
    if(available_backends[i]->info.id == id ||
       (name && strcasecompare(available_backends[i]->info.name, name))) {
      multissl_setup(available_backends[i]);
      return CURLSSLSET_OK;
    }
  }

  return CURLSSLSET_UNKNOWN_BACKEND;
}